

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_send_alert(ptls_t *tls,ptls_buffer_t *sendbuf,uint8_t level,uint8_t description)

{
  uint8_t *puVar1;
  size_t rec_start;
  uint8_t *puVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  
  rec_start = sendbuf->off;
  iVar5 = ptls_buffer_reserve(sendbuf,3);
  if (iVar5 == 0) {
    puVar2 = sendbuf->base;
    sVar3 = sendbuf->off;
    puVar1 = puVar2 + sVar3;
    puVar1[0] = '\x15';
    puVar1[1] = '\x03';
    puVar2[sVar3 + 2] = '\x03';
    sendbuf->off = sendbuf->off + 3;
    iVar5 = ptls_buffer_reserve(sendbuf,2);
    if (iVar5 == 0) {
      puVar1 = sendbuf->base;
      sVar3 = sendbuf->off;
      (puVar1 + sVar3)[0] = '\0';
      (puVar1 + sVar3)[1] = '\0';
      sVar3 = sendbuf->off;
      sendbuf->off = sVar3 + 2;
      iVar5 = ptls_buffer_reserve(sendbuf,2);
      if (iVar5 == 0) {
        puVar1 = sendbuf->base;
        sVar4 = sendbuf->off;
        puVar1[sVar4] = level;
        puVar1[sVar4 + 1] = description;
        sVar4 = sendbuf->off;
        sendbuf->off = sVar4 + 2;
        lVar6 = sVar4 - sVar3;
        sendbuf->base[sVar3] = (uint8_t)((ulong)lVar6 >> 8);
        sendbuf->base[sVar3 + 1] = (uint8_t)lVar6;
        iVar5 = 0;
        if (((tls->traffic_protection).enc.aead != (ptls_aead_context_t *)0x0) &&
           (PTLS_STATE_CLIENT_EXPECT_FINISHED < tls->state)) {
          iVar5 = buffer_encrypt_record(sendbuf,rec_start,&(tls->traffic_protection).enc);
          return iVar5;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int ptls_send_alert(ptls_t *tls, ptls_buffer_t *sendbuf, uint8_t level, uint8_t description)
{
    size_t rec_start = sendbuf->off;
    int ret = 0;

    buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_ALERT, { ptls_buffer_push(sendbuf, level, description); });
    /* encrypt the alert if we have the encryption keys, unless when it is the early data key */
    if (tls->traffic_protection.enc.aead != NULL && !(tls->state <= PTLS_STATE_CLIENT_EXPECT_FINISHED)) {
        if ((ret = buffer_encrypt_record(sendbuf, rec_start, &tls->traffic_protection.enc)) != 0)
            goto Exit;
    }

Exit:
    return ret;
}